

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O1

TValue * cpluaopen(lua_State *L,lua_CFunction dummy,void *ud)

{
  GCtab *pGVar1;
  GCstr *pGVar2;
  global_State *g;
  ulong uVar3;
  
  g = (global_State *)(ulong)(L->glref).ptr32;
  stack_init(L,L);
  pGVar1 = lj_tab_new(L,0,6);
  (L->env).gcptr32 = (uint32_t)pGVar1;
  uVar3 = (ulong)(L->glref).ptr32;
  pGVar1 = lj_tab_new(L,0,2);
  *(int *)(uVar3 + 0x118) = (int)pGVar1;
  *(undefined4 *)(uVar3 + 0x11c) = 0xfffffff4;
  lj_str_resize(L,0xff);
  lj_meta_init(L);
  lj_lex_init(L);
  pGVar2 = lj_err_str(L,LJ_ERR_ERRMEM);
  pGVar2->marked = pGVar2->marked | 0x20;
  (g->gc).threshold = (g->gc).total << 2;
  lj_ctype_initfin(L);
  lj_trace_initstate(g);
  return (TValue *)0x0;
}

Assistant:

static TValue *cpluaopen(lua_State *L, lua_CFunction dummy, void *ud)
{
  global_State *g = G(L);
  UNUSED(dummy);
  UNUSED(ud);
  stack_init(L, L);
  /* NOBARRIER: State initialization, all objects are white. */
  setgcref(L->env, obj2gco(lj_tab_new(L, 0, LJ_MIN_GLOBAL)));
  settabV(L, registry(L), lj_tab_new(L, 0, LJ_MIN_REGISTRY));
  lj_str_resize(L, LJ_MIN_STRTAB-1);
  lj_meta_init(L);
  lj_lex_init(L);
  fixstring(lj_err_str(L, LJ_ERR_ERRMEM));  /* Preallocate memory error msg. */
  g->gc.threshold = 4*g->gc.total;
#if LJ_HASFFI
  lj_ctype_initfin(L);
#endif
  lj_trace_initstate(g);
  lj_err_verify();
  return NULL;
}